

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CoverCrossBodySymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CoverCrossBodySymbol,slang::ast::Compilation&,slang::SourceLocation&>
          (BumpAllocator *this,Compilation *args,SourceLocation *args_1)

{
  CoverCrossBodySymbol *pCVar1;
  size_t in_RDX;
  Compilation *in_RSI;
  CoverCrossBodySymbol *in_RDI;
  SourceLocation unaff_retaddr;
  
  pCVar1 = (CoverCrossBodySymbol *)allocate((BumpAllocator *)in_RDI,(size_t)in_RSI,in_RDX);
  ast::CoverCrossBodySymbol::CoverCrossBodySymbol(in_RDI,in_RSI,unaff_retaddr);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }